

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ac67::
ARTCorrectnessTest_Node4DeleteKeyPrefixMerge_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_Node4DeleteKeyPrefixMerge_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  initializer_list<int> absent_keys;
  value_view v;
  const_reference pvVar1;
  inode_type_counter_array local_1a8;
  node_type_counter_array local_188;
  int local_158 [2];
  iterator local_150;
  undefined8 local_148;
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *local_140;
  unsigned_long local_138;
  unsigned_long in_stack_fffffffffffffed0;
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffed8;
  undefined1 local_e8 [8];
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  ARTCorrectnessTest_Node4DeleteKeyPrefixMerge_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  tree_verifier(in_stack_fffffffffffffed8,SUB81(in_stack_fffffffffffffed0 >> 0x38,0));
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  insert_key_range<int>
            ((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_e8,0x8001,2,false);
  pvVar1 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,3);
  v._M_ptr = pvVar1->_M_ptr;
  v._M_extent._M_extent_value = (pvVar1->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  insert<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               *)local_e8,0x90aa,v,false);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  assert_key_prefix_splits
            ((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_e8,1);
  local_138 = 3;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  assert_node_counts((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_e8,(node_type_counter_array *)&local_138);
  local_140 = (tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               *)local_e8;
  unodb::test::
  must_not_allocate<(anonymous_namespace)::ARTCorrectnessTest_Node4DeleteKeyPrefixMerge_Test<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::TestBody()::_lambda()_1_>
            ((anon_class_8_1_710c4454)local_140);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  check_present_values
            ((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_e8);
  local_158[0] = 0x90aa;
  local_158[1] = 0x8003;
  local_150 = local_158;
  local_148 = 2;
  absent_keys._M_len = 2;
  absent_keys._M_array = local_150;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  check_absent_keys<int>
            ((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_e8,absent_keys);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  assert_key_prefix_splits
            ((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_e8,1);
  local_188._M_elems[0] = 2;
  local_188._M_elems[1] = 1;
  local_188._M_elems[2] = 0;
  local_188._M_elems[3] = 0;
  local_188._M_elems[4] = 0;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  assert_node_counts((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_e8,&local_188);
  local_1a8._M_elems[0] = 1;
  local_1a8._M_elems[1] = 0;
  local_1a8._M_elems[2] = 0;
  local_1a8._M_elems[3] = 0;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  assert_shrinking_inodes
            ((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_e8,&local_1a8);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  ~tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *)local_e8);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node4DeleteKeyPrefixMerge) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(0x8001, 2);
  // Insert a value that does not share full prefix with the current Node4
  verifier.insert(0x90AA, unodb::test::test_values[3]);

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_key_prefix_splits(1);
  verifier.assert_node_counts({3, 2, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS

  // And delete it
  unodb::test::must_not_allocate([&verifier] { verifier.remove(0x90AA); });

  verifier.check_present_values();
  verifier.check_absent_keys({0x90AA, 0x8003});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_key_prefix_splits(1);
  verifier.assert_node_counts({2, 1, 0, 0, 0});
  verifier.assert_shrinking_inodes({1, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}